

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isofile_free_hardlinks(iso9660_conflict *iso9660)

{
  archive_rb_node *paVar1;
  long in_RDI;
  archive_rb_node *next;
  archive_rb_node *n;
  undefined8 local_10;
  
  local_10 = __archive_rb_tree_iterate((archive_rb_tree *)(in_RDI + 0xa8),(archive_rb_node *)0x0,0);
  while (local_10 != (archive_rb_node *)0x0) {
    paVar1 = __archive_rb_tree_iterate((archive_rb_tree *)(in_RDI + 0xa8),local_10,1);
    free(local_10);
    local_10 = paVar1;
  }
  return;
}

Assistant:

static void
isofile_free_hardlinks(struct iso9660 *iso9660)
{
	struct archive_rb_node *n, *next;

	for (n = ARCHIVE_RB_TREE_MIN(&(iso9660->hardlink_rbtree)); n;) {
		next = __archive_rb_tree_iterate(&(iso9660->hardlink_rbtree),
		    n, ARCHIVE_RB_DIR_RIGHT);
		free(n);
		n = next;
	}
}